

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (buffer_appender<char> out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  byte bVar1;
  int iVar2;
  buffer_appender<char> bVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  significand_type sVar8;
  uint uVar9;
  buffer<char> *buf;
  long lVar10;
  ulong uVar11;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  anon_class_28_7_94dcc806 write;
  int exp;
  undefined1 local_89 [5];
  sign_t local_84;
  int local_80;
  uint local_7c;
  decimal_fp<float> local_78;
  anon_class_56_7_a2a26a24 local_70;
  significand_type local_34;
  
  local_7c = fp->significand;
  uVar9 = 0x1f;
  if ((local_7c | 1) != 0) {
    for (; (local_7c | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  local_80 = (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar9 * 2) -
             (uint)(local_7c <
                   *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                            (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar9 * 2) * 4));
  local_78.exponent = fspecs._4_4_;
  local_84 = (uint)local_78.exponent >> 8 & 0xff;
  uVar7 = (ulong)((uint)(local_84 != none) + local_80);
  uVar9 = fp->exponent;
  sVar8 = uVar9 + local_80;
  local_78.significand = fspecs.precision;
  local_89[0] = decimal_point;
  local_78 = (decimal_fp<float>)fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_0012cb84:
    iVar4 = uVar9 + local_80 + -1;
    if (((uint)local_78.exponent >> 0x14 & 1) == 0) {
      uVar5 = 0;
      if (local_80 == 1) {
        local_89[0] = '\0';
      }
    }
    else {
      uVar5 = 0;
      if (0 < (int)(local_78.significand - local_80)) {
        uVar5 = (ulong)(local_78.significand - local_80);
      }
      uVar7 = uVar7 + uVar5;
    }
    iVar2 = 1 - sVar8;
    if (0 < (int)sVar8) {
      iVar2 = iVar4;
    }
    lVar10 = 2;
    if (99 < iVar2) {
      lVar10 = (ulong)(999 < iVar2) + 3;
    }
    uVar7 = (3 - (ulong)(local_89[0] == '\0')) + uVar7 + lVar10;
    local_70.sign = (sign_t *)(CONCAT44(local_7c,(uint)local_78.exponent >> 8) & 0xffffffff000000ff)
    ;
    local_70.significand._0_5_ = CONCAT14(local_89[0],local_80);
    local_70.significand_size =
         (int *)(CONCAT35(local_70.significand_size._5_3_,
                          CONCAT14((((uint)local_78.exponent >> 0x10 & 1) == 0) << 5,(int)uVar5)) |
                0x4500000000);
    local_70.fp = (decimal_fp<float> *)CONCAT44(local_70.fp._4_4_,iVar4);
    uVar5 = (ulong)specs->width;
    if ((long)uVar5 < 1) {
      uVar7 = uVar7 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                      .container + 0x10);
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18) < uVar7) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,uVar7);
      }
      bVar3 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
              ::anon_class_28_7_94dcc806::operator()
                        ((anon_class_28_7_94dcc806 *)&local_70,
                         (iterator)
                         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      return (buffer_appender<char>)
             bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar11 = 0;
    if (uVar7 <= uVar5) {
      uVar11 = uVar5 - uVar7;
    }
    bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                     (ulong)((byte)specs->field_0x9 & 0xf));
    uVar7 = uVar7 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 0x10) + (specs->fill).size_ * uVar11;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) < uVar7) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,uVar7);
    }
    uVar7 = uVar11 >> (bVar1 & 0x3f);
    bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar7,&specs->fill);
    it.container = (buffer<char> *)
                   write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                   ::anon_class_28_7_94dcc806::operator()
                             ((anon_class_28_7_94dcc806 *)&local_70,
                              bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar6 = 0x10;
      if (0 < (int)local_78.significand) {
        uVar6 = local_78.significand;
      }
      if (((int)sVar8 < -3) || ((int)uVar6 < (int)sVar8)) goto LAB_0012cb84;
    }
    local_34 = sVar8;
    if ((int)uVar9 < 0) {
      if ((int)sVar8 < 1) {
        uVar9 = -sVar8;
        local_70.fp = &local_78;
        local_89._1_4_ = uVar9;
        if (SBORROW4(local_78.significand,uVar9) != (int)(local_78.significand + sVar8) < 0) {
          local_89._1_4_ = local_78.significand;
        }
        if ((int)local_78.significand < 0) {
          local_89._1_4_ = uVar9;
        }
        if (local_80 != 0) {
          local_89._1_4_ = uVar9;
        }
        local_70.significand = (significand_type *)(local_89 + 1);
        uVar7 = (local_89._1_4_ + 2) + uVar7;
        local_70.sign = &local_84;
        local_70.significand_size = &local_80;
        local_70.fspecs = (float_specs *)local_89;
        local_70.decimal_point = (char *)&local_7c;
        uVar11 = 0;
        if (uVar7 <= (uint)specs->width) {
          uVar11 = (uint)specs->width - uVar7;
        }
        bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf));
        uVar7 = uVar7 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                        container + 0x10) + (specs->fill).size_ * uVar11;
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) < uVar7) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,uVar7)
          ;
        }
        uVar7 = uVar11 >> (bVar1 & 0x3f);
        bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar7,&specs->fill);
        it.container = (buffer<char> *)
                       write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                       ::anon_class_48_6_9afe1116::operator()
                                 ((anon_class_48_6_9afe1116 *)&local_70,
                                  bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container);
      }
      else {
        local_89._1_4_ = local_78.significand - local_80 & (local_78.exponent << 0xb) >> 0x1f;
        local_70.decimal_point = local_89 + 1;
        uVar5 = (ulong)(uint)local_89._1_4_;
        if ((int)local_89._1_4_ < 1) {
          uVar5 = 0;
        }
        uVar7 = uVar5 + 1 + uVar7;
        local_70.sign = &local_84;
        local_70.significand = &local_7c;
        local_70.significand_size = &local_80;
        local_70.fp = (decimal_fp<float> *)&local_34;
        local_70.fspecs = (float_specs *)local_89;
        uVar11 = 0;
        if (uVar7 <= (uint)specs->width) {
          uVar11 = (uint)specs->width - uVar7;
        }
        bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf));
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) <
            uVar7 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 0x10) + (specs->fill).size_ * uVar11) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        uVar7 = uVar11 >> (bVar1 & 0x3f);
        bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar7,&specs->fill);
        it.container = (buffer<char> *)
                       write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                       ::anon_class_48_6_48d028d1::operator()
                                 ((anon_class_48_6_48d028d1 *)&local_70,
                                  bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container);
      }
    }
    else {
      uVar7 = uVar7 + uVar9;
      local_89._1_4_ = local_78.significand - sVar8;
      if (((uint)local_78.exponent >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ != '\x02') && ((int)local_89._1_4_ < 1)) {
          local_89._1_4_ = 1;
        }
        if (0 < (long)(int)local_89._1_4_) {
          uVar7 = uVar7 + (long)(int)local_89._1_4_;
        }
      }
      local_70.sign = &local_84;
      local_70.significand = &local_7c;
      local_70.significand_size = &local_80;
      local_70.fspecs = (float_specs *)&local_78;
      local_70.decimal_point = local_89;
      local_70.num_zeros = (int *)(local_89 + 1);
      uVar11 = 0;
      if (uVar7 <= (uint)specs->width) {
        uVar11 = (uint)specs->width - uVar7;
      }
      bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)specs->field_0x9 & 0xf));
      local_70.fp = fp;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18) <
          uVar7 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10) + (specs->fill).size_ * uVar11) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar7 = uVar11 >> (bVar1 & 0x3f);
      bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar7,&specs->fill);
      it.container = (buffer<char> *)
                     write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                     ::anon_class_56_7_a2a26a24::operator()
                               (&local_70,
                                bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container);
    }
  }
  bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)it.container,uVar11 - uVar7,&specs->fill);
  return (buffer_appender<char>)
         bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}